

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgCreateGroups(Abc_TgMan_t *pMan)

{
  int nVars_00;
  int nWords_00;
  int nWords;
  int nVars;
  int nOnes;
  int i;
  int pStore [17];
  Abc_TgMan_t *pMan_local;
  
  nVars_00 = pMan->nVars;
  unique0x100001fb = pMan;
  nWords_00 = Abc_TtWordNum(nVars_00);
  if (0x10 < nVars_00) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x71a,"void Abc_TgCreateGroups(Abc_TgMan_t *)");
  }
  nWords = Abc_TtCountOnesInTruth(stack0xfffffffffffffff0->pTruth,nVars_00);
  if (nWords_00 * 0x20 < nWords) {
    Abc_TtNot(stack0xfffffffffffffff0->pTruth,nWords_00);
    nWords = nWords_00 * 0x40 - nWords;
    stack0xfffffffffffffff0->uPhase = 1 << ((byte)nVars_00 & 0x1f) | stack0xfffffffffffffff0->uPhase
    ;
  }
  Abc_TtCountOnesInCofs(stack0xfffffffffffffff0->pTruth,nVars_00,&nOnes);
  (&nOnes)[nVars_00] = nWords;
  for (nVars = 0; nVars < nVars_00; nVars = nVars + 1) {
    if ((&nOnes)[nVars] < nWords - (&nOnes)[nVars]) {
      Abc_TtFlip(stack0xfffffffffffffff0->pTruth,nWords_00,nVars);
      stack0xfffffffffffffff0->uPhase = 1 << ((byte)nVars & 0x1f) | stack0xfffffffffffffff0->uPhase;
      (&nOnes)[nVars] = nWords - (&nOnes)[nVars];
    }
  }
  Abc_TgSplitGroup(stack0xfffffffffffffff0,stack0xfffffffffffffff0->pGroup,&nOnes);
  stack0xfffffffffffffff0->fPhased = (uint)(nOnes << 1 != nWords);
  return;
}

Assistant:

static void Abc_TgCreateGroups(Abc_TgMan_t * pMan)
{
    int pStore[17];
    int i, nOnes;
    int nVars = pMan->nVars, nWords = Abc_TtWordNum(nVars);
    //TiedGroup * pGrp = pMan->pGroup;
    assert(nVars <= 16);
    // normalize polarity    
    nOnes = Abc_TtCountOnesInTruth(pMan->pTruth, nVars);
    if (nOnes > nWords * 32)
    {
        Abc_TtNot(pMan->pTruth, nWords);
        nOnes = nWords * 64 - nOnes;
        pMan->uPhase |= (1 << nVars);
    }
    // normalize phase
    Abc_TtCountOnesInCofs(pMan->pTruth, nVars, pStore);
    pStore[nVars] = nOnes;
    for (i = 0; i < nVars; i++)
    {
        if (pStore[i] >= nOnes - pStore[i])
            continue;
        Abc_TtFlip(pMan->pTruth, nWords, i);
        pMan->uPhase |= (1 << i);
        pStore[i] = nOnes - pStore[i];
    }

    Abc_TgSplitGroup(pMan, pMan->pGroup, pStore);
    pMan->fPhased = pStore[0] * 2 != nOnes;
}